

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2_debug_state.c
# Opt level: O0

void append_header_table_chunks
               (h2o_mem_pool_t *pool,h2o_iovec_vector_t *chunks,
               h2o_hpack_header_table_t *header_table)

{
  h2o_hpack_header_table_entry_t *phVar1;
  long lVar2;
  h2o_hpack_header_table_entry_t *entry;
  int i;
  h2o_hpack_header_table_t *header_table_local;
  h2o_iovec_vector_t *chunks_local;
  h2o_mem_pool_t *pool_local;
  
  for (entry._4_4_ = 0; (ulong)(long)entry._4_4_ < header_table->num_entries;
      entry._4_4_ = entry._4_4_ + 1) {
    phVar1 = h2o_hpack_header_table_get(header_table,(long)entry._4_4_);
    append_chunk(pool,chunks,"\n      [ \"%.*s\", \"%.*s\" ],",phVar1->name->len & 0xffffffff,
                 phVar1->name->base,phVar1->value->len & 0xffffffff,phVar1->value->base);
  }
  if (0 < entry._4_4_) {
    lVar2 = chunks->size - 1;
    chunks->entries[lVar2].len = chunks->entries[lVar2].len - 1;
  }
  return;
}

Assistant:

static void append_header_table_chunks(h2o_mem_pool_t *pool, h2o_iovec_vector_t *chunks, h2o_hpack_header_table_t *header_table)
{
    int i;
    for (i = 0; i < header_table->num_entries; i++) {
        h2o_hpack_header_table_entry_t *entry = h2o_hpack_header_table_get(header_table, i);
        append_chunk(pool, chunks, "\n"
                                   "      [ \"%.*s\", \"%.*s\" ],",
                     (int)entry->name->len, entry->name->base, (int)entry->value->len, entry->value->base);
    }

    if (i > 0) {
        // remove the last commna
        --chunks->entries[chunks->size - 1].len;
    }
}